

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O2

bool __thiscall S2BooleanOperation::Impl::AreRegionsIdentical(Impl *this)

{
  S2ShapeIndex *pSVar1;
  S2ShapeIndex *pSVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  long *plVar9;
  ulong uVar10;
  undefined8 uVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  ReferencePoint a_ref;
  ReferencePoint b_ref;
  long *plVar8;
  undefined4 extraout_var_00;
  
  pSVar1 = this->op_->regions_[0];
  pSVar2 = this->op_->regions_[1];
  if (pSVar1 == pSVar2) {
    uVar10 = 1;
  }
  else {
    iVar4 = (*pSVar1->_vptr_S2ShapeIndex[2])(pSVar1);
    iVar5 = (*pSVar2->_vptr_S2ShapeIndex[2])(pSVar2);
    uVar10 = 0;
    if (iVar4 == iVar5) {
      iVar5 = 0;
      if (0 < iVar4) {
        iVar5 = iVar4;
      }
      while (iVar13 = (int)uVar10, iVar13 != iVar5) {
        iVar6 = (*pSVar1->_vptr_S2ShapeIndex[3])(pSVar1,uVar10);
        plVar8 = (long *)CONCAT44(extraout_var,iVar6);
        iVar6 = (*pSVar2->_vptr_S2ShapeIndex[3])(pSVar2,uVar10);
        plVar9 = (long *)CONCAT44(extraout_var_00,iVar6);
        iVar6 = (**(code **)(*plVar8 + 0x20))(plVar8);
        iVar7 = (**(code **)(*plVar9 + 0x20))(plVar9);
        if (iVar6 != iVar7) {
LAB_001e769a:
          uVar10 = 0;
          goto LAB_001e769d;
        }
        iVar6 = (**(code **)(*plVar8 + 0x20))(plVar8);
        if (iVar6 == 2) {
          (**(code **)(*plVar8 + 0x28))(&a_ref,plVar8);
          (**(code **)(*plVar9 + 0x28))(&b_ref);
          bVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                            ((BasicVector<Vector3,_double,_3UL> *)&a_ref,&b_ref.point);
          if ((bVar3) || (a_ref.contained != b_ref.contained)) goto LAB_001e769a;
        }
        iVar6 = (**(code **)(*plVar8 + 0x30))(plVar8);
        iVar7 = (**(code **)(*plVar9 + 0x30))();
        iVar15 = 0;
        if (iVar6 != iVar7) goto LAB_001e769a;
        if (iVar6 < 1) {
          iVar6 = iVar15;
        }
        for (; iVar15 != iVar6; iVar15 = iVar15 + 1) {
          uVar10 = (**(code **)(*plVar8 + 0x38))(plVar8,iVar15);
          uVar11 = (**(code **)(*plVar9 + 0x38))(plVar9,iVar15);
          if ((int)uVar10 != (int)uVar11) {
            S2LogMessage::S2LogMessage
                      ((S2LogMessage *)&a_ref,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                       ,0x8a8,kFatal,(ostream *)&std::cerr);
            std::operator<<((ostream *)a_ref.point.c_[1],
                            "Check failed: (a_chain.start) == (b_chain.start) ");
            abort();
          }
          uVar12 = 0;
          iVar7 = (int)(uVar10 >> 0x20);
          if (iVar7 != (int)((ulong)uVar11 >> 0x20)) goto LAB_001e769a;
          uVar14 = uVar10 >> 0x20;
          if (iVar7 == 0 || (long)uVar10 < 0) {
            uVar14 = uVar12;
          }
          while ((int)uVar14 != (int)uVar12) {
            (**(code **)(*plVar8 + 0x40))(&a_ref,plVar8,iVar15,uVar12);
            (**(code **)(*plVar9 + 0x40))(&b_ref,plVar9,iVar15,uVar12);
            bVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                              ((BasicVector<Vector3,_double,_3UL> *)&a_ref,&b_ref.point);
            if (bVar3) goto LAB_001e769a;
            bVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                              ((BasicVector<Vector3,_double,_3UL> *)&a_ref.contained,
                               (D *)&b_ref.contained);
            uVar12 = (ulong)((int)uVar12 + 1);
            if (bVar3) goto LAB_001e769a;
          }
        }
        uVar10 = (ulong)(iVar13 + 1);
      }
      uVar10 = (ulong)(iVar4 <= iVar13);
    }
  }
LAB_001e769d:
  return SUB81(uVar10,0);
}

Assistant:

bool S2BooleanOperation::Impl::AreRegionsIdentical() const {
  const S2ShapeIndex* a = op_->regions_[0];
  const S2ShapeIndex* b = op_->regions_[1];
  if (a == b) return true;
  int num_shape_ids = a->num_shape_ids();
  if (num_shape_ids != b->num_shape_ids()) return false;
  for (int s = 0; s < num_shape_ids; ++s) {
    const S2Shape* a_shape = a->shape(s);
    const S2Shape* b_shape = b->shape(s);
    if (a_shape->dimension() != b_shape->dimension()) return false;
    if (a_shape->dimension() == 2) {
      auto a_ref = a_shape->GetReferencePoint();
      auto b_ref = b_shape->GetReferencePoint();
      if (a_ref.point != b_ref.point) return false;
      if (a_ref.contained != b_ref.contained) return false;
    }
    int num_chains = a_shape->num_chains();
    if (num_chains != b_shape->num_chains()) return false;
    for (int c = 0; c < num_chains; ++c) {
      S2Shape::Chain a_chain = a_shape->chain(c);
      S2Shape::Chain b_chain = b_shape->chain(c);
      S2_DCHECK_EQ(a_chain.start, b_chain.start);
      if (a_chain.length != b_chain.length) return false;
      for (int i = 0; i < a_chain.length; ++i) {
        S2Shape::Edge a_edge = a_shape->chain_edge(c, i);
        S2Shape::Edge b_edge = b_shape->chain_edge(c, i);
        if (a_edge.v0 != b_edge.v0) return false;
        if (a_edge.v1 != b_edge.v1) return false;
      }
    }
  }
  return true;
}